

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O1

void CuFailInternal(CuTest *tc,char *file,int line,CuString *string)

{
  char buf [8192];
  char acStack_2018 [8192];
  
  sprintf(acStack_2018,"%s:%d: ",file,line);
  CuStringInsert(string,acStack_2018,0);
  tc->failed = 1;
  tc->message = string->buffer;
  if ((__jmp_buf_tag *)tc->jumpBuf == (__jmp_buf_tag *)0x0) {
    return;
  }
  longjmp((__jmp_buf_tag *)tc->jumpBuf,0);
}

Assistant:

static void CuFailInternal(CuTest* tc, const char* file, int line, CuString* string)
{
	char buf[HUGE_STRING_LEN];

	sprintf(buf, "%s:%d: ", file, line);
	CuStringInsert(string, buf, 0);

	tc->failed = 1;
	tc->message = string->buffer;
	if (tc->jumpBuf != 0) longjmp(*(tc->jumpBuf), 0);
}